

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial_dist.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *in_00;
  long lVar3;
  int n;
  double p;
  delim_c local_56;
  delim_c local_55;
  int local_54;
  double local_50;
  param_type local_48;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_48.p_._0_1_ = 0x28;
  pbVar2 = utility::operator>>(in,(delim_c *)&local_48);
  in_00 = std::istream::_M_extract<double>((double *)pbVar2);
  local_55.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_00,&local_55);
  pbVar2 = (basic_istream<char,_std::char_traits<char>_> *)
           std::istream::operator>>((istream *)pbVar2,&local_54);
  local_56.c = ')';
  utility::operator>>(pbVar2,&local_56);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar3 + 0x20] & 5) == 0) {
    binomial_dist::param_type::param_type(&local_48,local_50,local_54);
    binomial_dist::param_type::operator=(P,&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_48.P_.super__Vector_base<double,_std::allocator<double>_>);
    lVar3 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar3 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(std::basic_istream<char_t, traits_t> &in,
                                                   binomial_dist::param_type &P) {
    double p;
    int n;
    std::ios_base::fmtflags flags(in.flags());
    in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    in >> utility::delim('(') >> p >> utility::delim(' ') >> n >> utility::delim(')');
    if (in)
      P = binomial_dist::param_type(p, n);
    in.flags(flags);
    return in;
  }